

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O3

void pool_destroy_all(void)

{
  uint uVar1;
  pool_info_t *pppVar2;
  ulong uVar3;
  
  uVar1 = prf_array_count(pools);
  if (1 < (uVar1 & 0xffff)) {
    uVar3 = 1;
    pppVar2 = pools;
    do {
      if (pppVar2[uVar3] != (pool_info_t)0x0) {
        pool_destroy((pool_t)uVar3);
        pppVar2 = pools;
      }
      uVar3 = uVar3 + 1;
    } while ((uVar1 & 0xffff) != uVar3);
  }
  return;
}

Assistant:

void
pool_destroy_all(
    void )
{
    pool_t pool_id, num_pools;
    num_pools = prf_array_count( pools );
    for ( pool_id = 1; pool_id < num_pools; pool_id++ ) {
       if ( pools[ pool_id ] != NULL )
           pool_destroy( pool_id );
    }
}